

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O1

void __thiscall QSplitter::setCollapsible(QSplitter *this,int index,bool collapse)

{
  long lVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  char local_28 [24];
  char *local_10;
  long local_8;
  
  uVar2 = (ulong)(uint)index;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((index < 0) ||
     (lVar1 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8,
     *(ulong *)(lVar1 + 0x298) <= uVar2)) {
    local_28[0] = '\x02';
    local_28[1] = '\0';
    local_28[2] = '\0';
    local_28[3] = '\0';
    local_28[4] = '\0';
    local_28[5] = '\0';
    local_28[6] = '\0';
    local_28[7] = '\0';
    local_28[8] = '\0';
    local_28[9] = '\0';
    local_28[10] = '\0';
    local_28[0xb] = '\0';
    local_28[0xc] = '\0';
    local_28[0xd] = '\0';
    local_28[0xe] = '\0';
    local_28[0xf] = '\0';
    local_28[0x10] = '\0';
    local_28[0x11] = '\0';
    local_28[0x12] = '\0';
    local_28[0x13] = '\0';
    local_28[0x14] = '\0';
    local_28[0x15] = '\0';
    local_28[0x16] = '\0';
    local_28[0x17] = '\0';
    local_10 = "default";
    QMessageLogger::warning(local_28,"QSplitter::setCollapsible: Index %d out of range",uVar2);
  }
  else {
    lVar1 = *(long *)(*(long *)(lVar1 + 0x290) + uVar2 * 8);
    *(byte *)(lVar1 + 0x14) = *(byte *)(lVar1 + 0x14) & 0xf9 | collapse * '\x02';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSplitter::setCollapsible(int index, bool collapse)
{
    Q_D(QSplitter);

    if (Q_UNLIKELY(index < 0 || index >= d->list.size())) {
        qWarning("QSplitter::setCollapsible: Index %d out of range", index);
        return;
    }
    d->list.at(index)->collapsible = collapse ? 1 : 0;
}